

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O1

size_t __thiscall
avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>::unionAdjust
          (SimpleParser<avro::parsing::ResolvingDecoderHandler> *this)

{
  unsigned_long uVar1;
  element_type *peVar2;
  pair<unsigned_long,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>
  *ppVar3;
  _Elt_pointer pSVar4;
  pointer __x;
  pair<unsigned_long,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>
  p;
  shared_count local_20;
  
  pSVar4 = (this->parsingStack).c.
           super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar4 == (this->parsingStack).c.
                super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    pSVar4 = (this->parsingStack).c.
             super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
  }
  if (pSVar4[-1].kind_ != sUnionAdjust) {
    throwMismatch(sUnionAdjust,pSVar4[-1].kind_);
  }
  ppVar3 = boost::
           any_cast<std::pair<unsigned_long,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>const&>
                     (&pSVar4[-1].extra_);
  uVar1 = ppVar3->first;
  peVar2 = (ppVar3->second).px;
  local_20.pi_ = (ppVar3->second).pn.pi_;
  if (local_20.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_20.pi_)->use_count_ = (local_20.pi_)->use_count_ + 1;
    UNLOCK();
  }
  std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
            (&(this->parsingStack).c);
  for (__x = (peVar2->
             super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>).
             _M_impl.super__Vector_impl_data._M_start;
      __x != (peVar2->
             super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>).
             _M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
    std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
              (&(this->parsingStack).c,__x);
  }
  boost::detail::shared_count::~shared_count(&local_20);
  return uVar1;
}

Assistant:

size_t unionAdjust() {
        const Symbol& s = parsingStack.top();
        assertMatch(Symbol::sUnionAdjust, s.kind());
        std::pair<size_t, ProductionPtr> p =
        s.extra<std::pair<size_t, ProductionPtr> >();
        parsingStack.pop();
        append(p.second);
        return p.first;
    }